

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::CodePointToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,uint32_t code_point)

{
  pointer pcVar1;
  undefined1 uVar2;
  byte bVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_t sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined1 uVar8;
  uint uVar9;
  char str [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  uVar9 = (uint)this;
  if (0x1fffff < uVar9) {
    String::FormatHexUInt32_abi_cxx11_(&local_30,(String *)this,code_point);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_30,0,0,"(Invalid Unicode 0x",0x13);
    local_50._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar7 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar7) {
      local_50.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_50._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_50,")");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar5->_M_dataplus)._M_p;
    paVar7 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar7) {
      uVar4 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p == &local_30.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  if (uVar9 < 0x80) {
    local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffff0000;
LAB_0012cb68:
    local_50._M_dataplus._M_p._0_1_ = (char)this;
  }
  else {
    uVar8 = SUB81(this,0);
    if (uVar9 < 0x800) {
      local_50._M_dataplus._M_p._1_7_ =
           CONCAT61((int6)((ulong)local_50._M_dataplus._M_p >> 0x10),uVar8) & 0xffffffffff003f |
           0x80;
      local_50._M_dataplus._M_p._0_1_ = (byte)((ulong)this >> 6) | 0xc0;
    }
    else {
      uVar2 = (undefined1)((ulong)this >> 6);
      bVar3 = (byte)((ulong)this >> 0xc);
      if (0xffff < uVar9) {
        local_50._M_dataplus._M_p =
             (pointer)((ulong)(CONCAT61(CONCAT51(CONCAT41((int)((ulong)local_50._M_dataplus._M_p >>
                                                               0x20),uVar8),uVar2),bVar3) &
                               0xffffff003f3f3f | 0x808080) << 8);
        this = (internal *)(ulong)(byte)((byte)(uVar9 >> 0x12) | 0xf0);
        goto LAB_0012cb68;
      }
      local_50._M_dataplus._M_p._1_7_ =
           CONCAT61(CONCAT51((int5)((ulong)local_50._M_dataplus._M_p >> 0x18),uVar8),uVar2) &
           0xffffffff003f3f | 0x8080;
      local_50._M_dataplus._M_p._0_1_ = bVar3 | 0xe0;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar6 = strlen((char *)&local_50);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,&local_50,(long)&local_50._M_dataplus._M_p + sVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string CodePointToUtf8(uint32_t code_point) {
  if (code_point > kMaxCodePoint4) {
    return "(Invalid Unicode 0x" + String::FormatHexUInt32(code_point) + ")";
  }

  char str[5];  // Big enough for the largest valid code point.
  if (code_point <= kMaxCodePoint1) {
    str[1] = '\0';
    str[0] = static_cast<char>(code_point);                          // 0xxxxxxx
  } else if (code_point <= kMaxCodePoint2) {
    str[2] = '\0';
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xC0 | code_point);                   // 110xxxxx
  } else if (code_point <= kMaxCodePoint3) {
    str[3] = '\0';
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xE0 | code_point);                   // 1110xxxx
  } else {  // code_point <= kMaxCodePoint4
    str[4] = '\0';
    str[3] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[2] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[1] = static_cast<char>(0x80 | ChopLowBits(&code_point, 6));  // 10xxxxxx
    str[0] = static_cast<char>(0xF0 | code_point);                   // 11110xxx
  }
  return str;
}